

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  bool bVar1;
  Enum EVar2;
  Type local_64;
  undefined1 local_60 [4];
  Type type;
  Token token;
  Type *out_type_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    Consume((Token *)local_60,this);
    local_64 = Token::type((Token *)local_60);
    EVar2 = Type::operator_cast_to_Enum(&local_64);
    if ((EVar2 == Anyref) &&
       (bVar1 = Features::reference_types_enabled(&this->options_->features), !bVar1)) {
      return false;
    }
    out_type->enum_ = (Enum)local_64;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::Anyref && !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}